

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O2

void __thiscall
SemanticAnalyserTest_BuildInFunctionIfDefined_Test::
~SemanticAnalyserTest_BuildInFunctionIfDefined_Test
          (SemanticAnalyserTest_BuildInFunctionIfDefined_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, BuildInFunctionIfDefined)
{
  std::string source = R"SRC(
  fn main(): f32
  {
    let x: f32 = if(1 == 1, 1, 0);
    ret 0;
  }
  )SRC";
  nothrowTest(source);
}